

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderError10::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError10 *this,uint n_program_object)

{
  allocator<char> local_1d;
  uint local_1c;
  TessellationShaderError10 *pTStack_18;
  uint n_program_object_local;
  TessellationShaderError10 *this_local;
  
  local_1c = n_program_object;
  pTStack_18 = this;
  this_local = (TessellationShaderError10 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices=4) out;\n\npatch out float test;\npatch out vec4  test2;\n\nvoid main()\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n    test                                = 1.0;\n    test2                               = vec4(0.1, 0.2, 0.3, 0.4);\n}\n"
             ,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError10::getTessellationControlShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (vertices=4) out;\n"
		   "\n"
		   "patch out float test;\n"
		   "patch out vec4  test2;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
		   "    gl_TessLevelOuter[0]                = 1.0;\n"
		   "    gl_TessLevelOuter[1]                = 1.0;\n"
		   "    test                                = 1.0;\n"
		   "    test2                               = vec4(0.1, 0.2, 0.3, 0.4);\n"
		   "}\n";
}